

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O2

void __thiscall CHog::exportFeatVect(CHog *this,string *exportPath,int x,int y,int w,int h,int l)

{
  histCell **pphVar1;
  histCell *phVar2;
  void *pvVar3;
  ulong uVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int n;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  ofstream of;
  
  std::ofstream::ofstream(&of,(exportPath->_M_dataplus)._M_p,_S_app);
  pphVar1 = this->hist;
  lVar8 = (long)(x + 1);
  lVar6 = (long)pphVar1[(long)y + 1][lVar8].dim * (long)(h * w);
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)lVar6) {
    uVar4 = lVar6 * 8;
  }
  pvVar3 = operator_new__(uVar4);
  lVar6 = (long)y + 1;
  uVar7 = 0;
  uVar4 = 0;
  if (0 < w) {
    uVar4 = (ulong)(uint)w;
  }
  uVar13 = (ulong)(uint)h;
  if (h < 1) {
    uVar13 = uVar7;
  }
  uVar11 = 0;
  while( true ) {
    lVar10 = lVar8 * 0x30 + 0x20;
    uVar12 = uVar7;
    uVar14 = uVar4;
    if (uVar11 == uVar13) break;
    while (bVar15 = uVar14 != 0, uVar14 = uVar14 - 1, bVar15) {
      phVar2 = pphVar1[lVar6 + uVar11];
      lVar9 = (long)*(int *)((long)&phVar2->cellBinsHalf + lVar10);
      memcpy((void *)((long)pvVar3 + uVar12 * lVar9 * 8),*(void **)((long)phVar2 + lVar10 + -0x10),
             lVar9 << 3);
      lVar10 = lVar10 + 0x30;
      uVar12 = uVar12 + 1;
    }
    uVar11 = uVar11 + 1;
    uVar7 = uVar7 + (long)w;
  }
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&of,l);
  std::operator<<(poVar5,"\t");
  for (lVar10 = 0; lVar10 < (long)this->hist[lVar6][lVar8].dim * (long)(h * w); lVar10 = lVar10 + 1)
  {
    poVar5 = std::ostream::_M_insert<double>(*(double *)((long)pvVar3 + lVar10 * 8));
    std::operator<<(poVar5,"\t");
  }
  std::operator<<((ostream *)&of,"\n");
  std::ofstream::close();
  operator_delete__(pvVar3);
  std::ofstream::~ofstream(&of);
  return;
}

Assistant:

void CHog::exportFeatVect(string exportPath, int x, int y, int w, int h, int l)
{
    ofstream of(exportPath.c_str(), ios::app);
    x += 1;
    y += 1;
    double* featVect = new double[w*h*hist[y][x].dim];
    for(int i=0; i<h; i++)
    {
        for(int j=0; j<w; j++)
            memcpy(featVect+(i*w+j)*hist[y+i][x+j].dim, hist[y+i][x+j].feat, sizeof(double)*hist[y+i][x+j].dim);
    }
    of<<l<<"\t";
    for(int n=0; n<w*h*hist[y][x].dim; n++)
//        of<<n+1<<":"<<featVect[n]<<"\t";
        of<<featVect[n]<<"\t";
    of<<"\n";
    of.close();
    delete[] featVect;
}